

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O1

void report_failed_pipeline(void)

{
  uint uVar1;
  pointer pPVar2;
  ulong uVar3;
  Hash HVar4;
  char *__format;
  long in_FS_OFFSET;
  
  if (global_replayer == (ThreadedReplayer *)0x0) {
    return;
  }
  uVar1 = *(uint *)(in_FS_OFFSET + -0x18);
  pPVar2 = (global_replayer->per_thread_data).
           super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  HVar4 = pPVar2[uVar1].current_graphics_pipeline;
  if (HVar4 == 0) {
    HVar4 = pPVar2[uVar1].current_compute_pipeline;
    if (HVar4 == 0) {
      HVar4 = pPVar2[uVar1].current_raytracing_pipeline;
      if (HVar4 == 0) {
        return;
      }
      uVar3 = (ulong)(pPVar2[uVar1].current_raytracing_index - 1);
      __format = 
      "Fossilize ERROR: Raytracing pipeline crashed or hung, hash: %016lx. Rerun with: --raytracing-pipeline-range %u %u.\n"
      ;
    }
    else {
      uVar3 = (ulong)(pPVar2[uVar1].current_compute_index - 1);
      __format = 
      "Fossilize ERROR: Compute pipeline crashed or hung, hash: %016lx. Rerun with: --compute-pipeline-range %u %u.\n"
      ;
    }
  }
  else {
    uVar3 = (ulong)(pPVar2[uVar1].current_graphics_index - 1);
    __format = 
    "Fossilize ERROR: Graphics pipeline crashed or hung: %016lx. Rerun with: --graphics-pipeline-range %u %u.\n"
    ;
  }
  fprintf(_stderr,__format,HVar4,uVar3);
  fflush(_stderr);
  return;
}

Assistant:

static void report_failed_pipeline()
{
	if (global_replayer)
	{
		auto *per_thread = &global_replayer->get_per_thread_data();

		if (per_thread->current_graphics_pipeline)
		{
			unsigned index = per_thread->current_graphics_index - 1;
			LOGE("Graphics pipeline crashed or hung: %016" PRIx64 ". Rerun with: --graphics-pipeline-range %u %u.\n",
			     per_thread->current_graphics_pipeline, index, index + 1);
		}
		else if (per_thread->current_compute_pipeline)
		{
			unsigned index = per_thread->current_compute_index - 1;
			LOGE("Compute pipeline crashed or hung, hash: %016" PRIx64 ". Rerun with: --compute-pipeline-range %u %u.\n",
			     per_thread->current_compute_pipeline, index, index + 1);
		}
		else if (per_thread->current_raytracing_pipeline)
		{
			unsigned index = per_thread->current_raytracing_index - 1;
			LOGE("Raytracing pipeline crashed or hung, hash: %016" PRIx64 ". Rerun with: --raytracing-pipeline-range %u %u.\n",
			     per_thread->current_raytracing_pipeline, index, index + 1);
		}
	}
}